

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O2

Vec3i __thiscall embree::XMLLoader::load<embree::Vec3<int>>(XMLLoader *this,Ref<embree::XML> *xml)

{
  Token *this_00;
  int iVar1;
  int iVar2;
  int iVar3;
  runtime_error *this_01;
  undefined4 extraout_EDX;
  long *in_RDX;
  Vec3i VVar4;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  this_00 = *(Token **)(*in_RDX + 0x98);
  if (*(long *)(*in_RDX + 0xa0) - (long)this_00 == 0xd8) {
    iVar1 = Token::Int(this_00);
    iVar2 = Token::Int((Token *)(*(long *)(*in_RDX + 0x98) + 0x48));
    iVar3 = Token::Int((Token *)(*(long *)(*in_RDX + 0x98) + 0x90));
    *(int *)&(this->path).filename._M_dataplus._M_p = iVar1;
    *(int *)((long)&(this->path).filename._M_dataplus._M_p + 4) = iVar2;
    *(int *)&(this->path).filename._M_string_length = iVar3;
    VVar4.field_0.field_0.z = extraout_EDX;
    VVar4.field_0._0_8_ = this;
    return (Vec3i)VVar4.field_0;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  ParseLocation::str_abi_cxx11_(&local_60,(ParseLocation *)(*in_RDX + 0x10));
  std::operator+(&local_40,&local_60,": wrong int3 body");
  std::runtime_error::runtime_error(this_01,(string *)&local_40);
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Vec3i XMLLoader::load<Vec3i>(const Ref<XML>& xml) {
    if (xml->body.size() != 3) THROW_RUNTIME_ERROR(xml->loc.str()+": wrong int3 body");
    return Vec3i(xml->body[0].Int(),xml->body[1].Int(),xml->body[2].Int());
  }